

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O2

int KINLinSolDrv(KINMem kin_mem)

{
  N_Vector p_Var1;
  N_Vector p_Var2;
  bool bVar3;
  int iVar4;
  
  if (kin_mem->kin_nni - kin_mem->kin_nnilset < kin_mem->kin_msbset) {
    bVar3 = 1.5 < kin_mem->kin_sthrsh;
  }
  else {
    kin_mem->kin_sthrsh = 2.0;
    kin_mem->kin_update_fnorm_sub = 1;
    bVar3 = true;
  }
  kin_mem->kin_jacCurrent = 0;
  if (!bVar3) goto LAB_0010bf4b;
  while( true ) {
    if (kin_mem->kin_lsetup != (_func_int_KINMemRec_ptr *)0x0) {
      iVar4 = (*kin_mem->kin_lsetup)(kin_mem);
      kin_mem->kin_jacCurrent = 1;
      kin_mem->kin_nnilset = kin_mem->kin_nni;
      kin_mem->kin_nnilset_sub = kin_mem->kin_nni;
      if (iVar4 != 0) {
        return -0xb;
      }
    }
LAB_0010bf4b:
    p_Var1 = kin_mem->kin_pp;
    p_Var2 = kin_mem->kin_unew;
    N_VScale(0xbff0000000000000,kin_mem->kin_fval,p_Var2);
    iVar4 = (*kin_mem->kin_lsolve)
                      (kin_mem,p_Var1,p_Var2,&kin_mem->kin_sJpnorm,&kin_mem->kin_sFdotJp);
    if (iVar4 == 0) {
      return 0;
    }
    if (iVar4 < 0) {
      return -0xc;
    }
    if (kin_mem->kin_lsetup == (_func_int_KINMemRec_ptr *)0x0) break;
    if (kin_mem->kin_jacCurrent != 0) {
      return -9;
    }
    kin_mem->kin_sthrsh = 2.0;
    kin_mem->kin_jacCurrent = 0;
  }
  return -9;
}

Assistant:

static int KINLinSolDrv(KINMem kin_mem)
{
  N_Vector x, b;
  int retval;

  if ((kin_mem->kin_nni - kin_mem->kin_nnilset) >= kin_mem->kin_msbset)
  {
    kin_mem->kin_sthrsh           = TWO;
    kin_mem->kin_update_fnorm_sub = SUNTRUE;
  }

  for (;;)
  {
    kin_mem->kin_jacCurrent = SUNFALSE;

    if ((kin_mem->kin_sthrsh > ONEPT5) && (kin_mem->kin_lsetup != NULL))
    {
      retval                   = kin_mem->kin_lsetup(kin_mem);
      kin_mem->kin_jacCurrent  = SUNTRUE;
      kin_mem->kin_nnilset     = kin_mem->kin_nni;
      kin_mem->kin_nnilset_sub = kin_mem->kin_nni;
      if (retval != 0) { return (KIN_LSETUP_FAIL); }
    }

    /* rename vectors for readability */

    b = kin_mem->kin_unew;
    x = kin_mem->kin_pp;

    /* load b with the current value of -fval */

    N_VScale(-ONE, kin_mem->kin_fval, b);

    /* call the generic 'lsolve' routine to solve the system Jx = b */

    retval = kin_mem->kin_lsolve(kin_mem, x, b, &(kin_mem->kin_sJpnorm),
                                 &(kin_mem->kin_sFdotJp));

    if (retval == 0) { return (KIN_SUCCESS); }
    else if (retval < 0) { return (KIN_LSOLVE_FAIL); }
    else if ((kin_mem->kin_lsetup == NULL) || (kin_mem->kin_jacCurrent))
    {
      return (KIN_LINSOLV_NO_RECOVERY);
    }

    /* loop back only if the linear solver setup is in use
       and Jacobian information is not current */

    kin_mem->kin_sthrsh = TWO;
  }
}